

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetFilteredSignal
               (int half_average_length,int fft_size,fft_complex *y_spectrum,int y_length,
               double *filtered_signal)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  fft_plan p_02;
  ulong uVar3;
  int in_ECX;
  double *in_RDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  int i_2;
  int index_bias;
  fft_plan inverseFFT;
  int i_1;
  double tmp;
  fft_plan forwardFFT;
  fft_complex *low_pass_filter_spectrum;
  int i;
  double *low_pass_filter;
  undefined8 in_stack_fffffffffffffda8;
  fft_complex *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc4;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int iVar4;
  double *in_stack_fffffffffffffe00;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [40];
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int iVar5;
  undefined4 in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  double *in_stack_fffffffffffffec0;
  undefined1 local_120 [76];
  int local_d4;
  double local_d0;
  undefined1 local_c8 [20];
  uint uStack_b4;
  double *pdStack_b0;
  fft_complex *local_a8;
  undefined8 uStack_a0;
  int iStack_9c;
  undefined1 local_80 [72];
  double *local_38;
  int local_2c;
  void *local_28;
  long local_20;
  int local_14;
  double *local_10;
  int local_8;
  int local_4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ESI;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  local_28 = operator_new__(uVar3);
  NuttallWindow(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8);
  for (local_2c = local_4 << 2; local_2c < local_8; local_2c = local_2c + 1) {
    *(undefined8 *)((long)local_28 + (long)local_2c * 8) = 0;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_8;
  uVar3 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_38 = (double *)operator_new__(uVar3);
  fft_plan_dft_r2c_1d(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                      (uint)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  memcpy(local_c8,local_80,0x48);
  p_01._8_8_ = in_stack_fffffffffffffe88;
  p_01.n = (int)in_stack_fffffffffffffe80;
  p_01.sign = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  p_01.c_in._0_4_ = in_stack_fffffffffffffe90;
  p_01.c_in._4_4_ = in_stack_fffffffffffffe94;
  p_01.in = (double *)in_stack_fffffffffffffe98;
  p_01.c_out = (fft_complex *)in_stack_fffffffffffffea0;
  p_01.out = (double *)in_stack_fffffffffffffea8;
  p_01.input = (double *)in_stack_fffffffffffffeb0;
  p_01.ip = (int *)in_stack_fffffffffffffeb8;
  p_01.w = in_stack_fffffffffffffec0;
  fft_execute(p_01);
  local_d0 = *local_10 * *local_38 + -(local_10[1] * local_38[1]);
  local_38[1] = *local_10 * local_38[1] + local_10[1] * *local_38;
  *local_38 = local_d0;
  for (local_d4 = 1; local_d4 <= local_8 / 2; local_d4 = local_d4 + 1) {
    local_d0 = local_10[(long)local_d4 * 2] * local_38[(long)local_d4 * 2] +
               -(local_10[(long)local_d4 * 2 + 1] * local_38[(long)local_d4 * 2 + 1]);
    local_38[(long)local_d4 * 2 + 1] =
         local_10[(long)local_d4 * 2] * local_38[(long)local_d4 * 2 + 1] +
         local_10[(long)local_d4 * 2 + 1] * local_38[(long)local_d4 * 2];
    local_38[(long)local_d4 * 2] = local_d0;
    local_38[(long)((local_8 - local_d4) + -1) * 2] = local_38[(long)local_d4 * 2];
    local_38[(long)((local_8 - local_d4) + -1) * 2 + 1] = local_38[(long)local_d4 * 2 + 1];
  }
  iVar4 = local_d4;
  fft_plan_dft_c2r_1d(iStack_9c,local_a8,pdStack_b0,uStack_b4);
  memcpy(&stack0xfffffffffffffe98,local_120,0x48);
  p_02._8_8_ = in_stack_fffffffffffffe88;
  p_02.n = (int)in_stack_fffffffffffffe80;
  p_02.sign = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  p_02.c_in._0_4_ = in_stack_fffffffffffffe90;
  p_02.c_in._4_4_ = in_stack_fffffffffffffe94;
  p_02.in = (double *)in_stack_fffffffffffffe98;
  p_02.c_out = (fft_complex *)in_stack_fffffffffffffea0;
  p_02.out = (double *)in_stack_fffffffffffffea8;
  p_02.input = (double *)in_stack_fffffffffffffeb0;
  p_02.ip = (int *)in_stack_fffffffffffffeb8;
  p_02.w = in_stack_fffffffffffffec0;
  fft_execute(p_02);
  for (iVar5 = 0; iVar5 < local_14; iVar5 = iVar5 + 1) {
    *(undefined8 *)(local_20 + (long)iVar5 * 8) =
         *(undefined8 *)(local_20 + (long)(iVar5 + local_4 * 2) * 8);
  }
  memcpy(local_1b8,local_120,0x48);
  p._8_8_ = local_188;
  p.n = (undefined4)uStack_190;
  p.sign = uStack_190._4_4_;
  p.c_in = (fft_complex *)in_stack_fffffffffffffe80;
  p.in = (double *)in_stack_fffffffffffffe88;
  p.c_out = (fft_complex *)in_stack_fffffffffffffde0;
  p.out = (double *)in_stack_fffffffffffffde8;
  p.input = (double *)in_stack_fffffffffffffdf0;
  p.ip._0_4_ = in_stack_fffffffffffffdf8;
  p.ip._4_4_ = iVar4;
  p.w = in_stack_fffffffffffffe00;
  fft_destroy_plan(p);
  memcpy(&stack0xfffffffffffffe00,local_80,0x48);
  p_00._8_8_ = local_1d0;
  p_00._0_8_ = uStack_1d8;
  p_00.c_in = (fft_complex *)uStack_1c8;
  p_00.in = (double *)local_1c0;
  p_00.c_out = (fft_complex *)in_stack_fffffffffffffde0;
  p_00.out = (double *)in_stack_fffffffffffffde8;
  p_00.input = (double *)in_stack_fffffffffffffdf0;
  p_00.ip._0_4_ = in_stack_fffffffffffffdf8;
  p_00.ip._4_4_ = iVar4;
  p_00.w = in_stack_fffffffffffffe00;
  fft_destroy_plan(p_00);
  if (local_38 != (double *)0x0) {
    operator_delete__(local_38);
  }
  if (local_28 != (void *)0x0) {
    operator_delete__(local_28);
  }
  return;
}

Assistant:

static void GetFilteredSignal(int half_average_length, int fft_size,
    const fft_complex *y_spectrum, int y_length, double *filtered_signal) {
  double *low_pass_filter = new double[fft_size];
  // Nuttall window is used as a low-pass filter.
  // Cutoff frequency depends on the window length.
  NuttallWindow(half_average_length * 4, low_pass_filter);
  for (int i = half_average_length * 4; i < fft_size; ++i)
    low_pass_filter[i] = 0.0;

  fft_complex *low_pass_filter_spectrum = new fft_complex[fft_size];
  fft_plan forwardFFT = fft_plan_dft_r2c_1d(fft_size, low_pass_filter,
      low_pass_filter_spectrum, FFT_ESTIMATE);
  fft_execute(forwardFFT);

  // Convolution
  double tmp = y_spectrum[0][0] * low_pass_filter_spectrum[0][0] -
    y_spectrum[0][1] * low_pass_filter_spectrum[0][1];
  low_pass_filter_spectrum[0][1] =
    y_spectrum[0][0] * low_pass_filter_spectrum[0][1] +
    y_spectrum[0][1] * low_pass_filter_spectrum[0][0];
  low_pass_filter_spectrum[0][0] = tmp;
  for (int i = 1; i <= fft_size / 2; ++i) {
    tmp = y_spectrum[i][0] * low_pass_filter_spectrum[i][0] -
      y_spectrum[i][1] * low_pass_filter_spectrum[i][1];
    low_pass_filter_spectrum[i][1] =
      y_spectrum[i][0] * low_pass_filter_spectrum[i][1] +
      y_spectrum[i][1] * low_pass_filter_spectrum[i][0];
    low_pass_filter_spectrum[i][0] = tmp;
    low_pass_filter_spectrum[fft_size - i - 1][0] =
      low_pass_filter_spectrum[i][0];
    low_pass_filter_spectrum[fft_size - i - 1][1] =
      low_pass_filter_spectrum[i][1];
  }

  fft_plan inverseFFT = fft_plan_dft_c2r_1d(fft_size,
    low_pass_filter_spectrum, filtered_signal, FFT_ESTIMATE);
  fft_execute(inverseFFT);

  // Compensation of the delay.
  int index_bias = half_average_length * 2;
  for (int i = 0; i < y_length; ++i)
    filtered_signal[i] = filtered_signal[i + index_bias];

  fft_destroy_plan(inverseFFT);
  fft_destroy_plan(forwardFFT);
  delete[] low_pass_filter_spectrum;
  delete[] low_pass_filter;
}